

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O1

void Cnf_DataFree(Cnf_Dat_t *p)

{
  int *__ptr;
  
  if (p != (Cnf_Dat_t *)0x0) {
    if (p->vMapping != (Vec_Int_t *)0x0) {
      __ptr = p->vMapping->pArray;
      if (__ptr != (int *)0x0) {
        free(__ptr);
        p->vMapping->pArray = (int *)0x0;
      }
      if (p->vMapping != (Vec_Int_t *)0x0) {
        free(p->vMapping);
        p->vMapping = (Vec_Int_t *)0x0;
      }
    }
    if (p->pClaPols != (uchar *)0x0) {
      free(p->pClaPols);
      p->pClaPols = (uchar *)0x0;
    }
    if (p->pObj2Clause != (int *)0x0) {
      free(p->pObj2Clause);
      p->pObj2Clause = (int *)0x0;
    }
    if (p->pObj2Count != (int *)0x0) {
      free(p->pObj2Count);
      p->pObj2Count = (int *)0x0;
    }
    if (*p->pClauses != (int *)0x0) {
      free(*p->pClauses);
      *p->pClauses = (int *)0x0;
    }
    if (p->pClauses != (int **)0x0) {
      free(p->pClauses);
      p->pClauses = (int **)0x0;
    }
    if (p->pVarNums != (int *)0x0) {
      free(p->pVarNums);
      p->pVarNums = (int *)0x0;
    }
    free(p);
    return;
  }
  return;
}

Assistant:

void Cnf_DataFree( Cnf_Dat_t * p )
{
    if ( p == NULL )
        return;
    Vec_IntFreeP( &p->vMapping );
    ABC_FREE( p->pClaPols );
    ABC_FREE( p->pObj2Clause );
    ABC_FREE( p->pObj2Count );
    ABC_FREE( p->pClauses[0] );
    ABC_FREE( p->pClauses );
    ABC_FREE( p->pVarNums );
    ABC_FREE( p );
}